

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O1

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  connectdata *pcVar2;
  curl_socket_t cVar3;
  curl_sslbackend cVar4;
  long lVar5;
  curl_slist *pcVar6;
  void *pvVar7;
  double dVar8;
  char *pcVar9;
  char *pcVar10;
  CURLcode CVar11;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar11 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x10001e) {
      if (info != CURLINFO_EFFECTIVE_URL) {
        if (info == CURLINFO_CONTENT_TYPE) {
          pcVar9 = (data->info).contenttype;
        }
        else {
          if (info != CURLINFO_PRIVATE) {
            return CURLE_UNKNOWN_OPTION;
          }
          pcVar9 = (char *)(data->set).private_data;
        }
        goto LAB_00122f40;
      }
      pcVar9 = (data->change).url;
      pcVar10 = "";
      if (pcVar9 != (char *)0x0) {
        pcVar10 = pcVar9;
      }
      *local_c8 = (double)pcVar10;
      goto LAB_00123138;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar9 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar9 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      pcVar9 = (data->info).conn_primary_ip;
      goto LAB_00122f0b;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_00122b24_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar9 = (data->set).str[0x2f];
      break;
    case CURLINFO_LOCAL_IP:
      pcVar9 = (data->info).conn_local_ip;
LAB_00122f0b:
      *local_c8 = (double)pcVar9;
      goto LAB_00123138;
    default:
      if (info != CURLINFO_SCHEME) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar9 = (data->info).conn_scheme;
    }
LAB_00122f40:
    *local_c8 = (double)pcVar9;
    goto LAB_00123138;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_RESPONSE_CODE:
      dVar8 = (double)(long)(data->info).httpcode;
      break;
    default:
      goto switchD_00122b24_default;
    case CURLINFO_HEADER_SIZE:
      dVar8 = (double)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      dVar8 = (double)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      dVar8 = (double)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      dVar8 = (double)(data->info).filetime;
      break;
    case CURLINFO_REDIRECT_COUNT:
      dVar8 = (double)(data->set).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      dVar8 = (double)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      dVar8 = (double)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      dVar8 = (double)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      dVar8 = (double)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      dVar8 = (double)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar3 = Curl_getconnectinfo(data,(connectdata **)0x0);
      if (cVar3 != -1) {
        *local_c8 = (double)(long)cVar3;
        return CURLE_OK;
      }
      *local_c8 = -NAN;
      return CURLE_OK;
    case CURLINFO_CONDITION_UNMET:
      dVar8 = (double)(ulong)(data->info).timecond;
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      dVar8 = (double)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      dVar8 = (double)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      dVar8 = (double)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      dVar8 = (double)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      dVar8 = (double)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 == 0x14) {
        *local_c8 = 1.48219693752374e-323;
      }
      else if (iVar1 == 0xb) {
        *local_c8 = 9.88131291682493e-324;
      }
      else if (iVar1 == 10) {
        *local_c8 = 4.94065645841247e-324;
      }
      else {
        *local_c8 = 0.0;
      }
      goto LAB_00123138;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      dVar8 = (double)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      dVar8 = (double)(ulong)(data->info).conn_protocol;
    }
    *local_c8 = dVar8;
    goto LAB_00123138;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar6 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar6 = Curl_cookie_list(data);
      }
      *local_c8 = (double)pcVar6;
    }
    else if (info == CURLINFO_CERTINFO) {
      *local_c8 = (double)&(data->info).certs;
    }
    else {
      if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar2 = data->easy_conn;
      *local_c8 = (double)&data->tsi;
      cVar4 = Curl_ssl_backend();
      (data->tsi).backend = cVar4;
      (data->tsi).internals = (void *)0x0;
      if (cVar4 == CURLSSLBACKEND_NONE || pcVar2 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      lVar5 = 0;
      while ((&pcVar2->ssl[0].use)[lVar5] != true) {
        lVar5 = lVar5 + 0x18;
        if (lVar5 != 0x18) {
          return CURLE_OK;
        }
      }
      pvVar7 = (*Curl_ssl->get_internals)((ssl_connect_data *)(&pcVar2->ssl[0].use + lVar5),info);
      (data->tsi).internals = pvVar7;
    }
    goto LAB_00123138;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar3 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar3;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_SIZE_UPLOAD_T:
      pcVar9 = (char *)(data->progress).uploaded;
      break;
    case CURLINFO_SIZE_DOWNLOAD_T:
      pcVar9 = (char *)(data->progress).downloaded;
      break;
    case CURLINFO_SPEED_DOWNLOAD_T:
      pcVar9 = (char *)(data->progress).dlspeed;
      break;
    case CURLINFO_SPEED_UPLOAD_T:
      pcVar9 = (char *)(data->progress).ulspeed;
      break;
    default:
      goto switchD_00122b24_default;
    case CURLINFO_FILETIME_T:
      pcVar9 = (char *)(data->info).filetime;
      break;
    case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
      pcVar9 = (char *)0xffffffffffffffff;
      if (((data->progress).flags & 0x40) != 0) {
        pcVar9 = (char *)(data->progress).size_dl;
      }
      break;
    case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
      pcVar9 = (char *)0xffffffffffffffff;
      if (((data->progress).flags & 0x20) != 0) {
        pcVar9 = (char *)(data->progress).size_ul;
      }
    }
    goto LAB_00122f40;
  default:
    goto switchD_00122b24_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar8 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar8 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar8 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar8 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar8 = (double)(data->progress).uploaded;
    goto LAB_00122fe0;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar8 = (double)(data->progress).downloaded;
    goto LAB_00122fe0;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar8 = (double)(data->progress).dlspeed;
    goto LAB_00122fe0;
  case CURLINFO_SPEED_UPLOAD:
    dVar8 = (double)(data->progress).ulspeed;
    goto LAB_00122fe0;
  default:
    goto switchD_00122b24_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_0012302b:
      dVar8 = -1.0;
    }
    else {
      dVar8 = (double)(data->progress).size_dl;
    }
    goto LAB_00122fe0;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_0012302b;
    dVar8 = (double)(data->progress).size_ul;
    goto LAB_00122fe0;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar8 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar8 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar8 = (double)(data->progress).t_appconnect;
  }
  dVar8 = dVar8 / 1000000.0;
LAB_00122fe0:
  *local_c8 = dVar8;
LAB_00123138:
  CVar11 = CURLE_OK;
switchD_00122b24_default:
  return CVar11;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}